

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.hpp
# Opt level: O0

bool __thiscall Token::isTermOperator(Token *this)

{
  bool bVar1;
  undefined1 local_11;
  Token *this_local;
  
  bVar1 = isMultiplicationOperator(this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = isDivisionOperator(this);
    local_11 = true;
    if (!bVar1) {
      bVar1 = isModuloOperator(this);
      local_11 = true;
      if (!bVar1) {
        local_11 = isIntegerDivisionOperator(this);
      }
    }
  }
  return local_11;
}

Assistant:

bool isTermOperator() const {
        return isMultiplicationOperator()
        || isDivisionOperator()
        || isModuloOperator()
        || isIntegerDivisionOperator();
    }